

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O0

void __thiscall
luna::SemanticAnalysisVisitor::Visit
          (SemanticAnalysisVisitor *this,ElseIfStatement *elseif_stmt,void *data)

{
  bool bVar1;
  pointer pSVar2;
  Guard *in_RDI;
  Guard g;
  ExpVarData exp_var_data;
  anon_class_8_1_8991fb9c *__f;
  function<void_()> *in_stack_ffffffffffffff50;
  function<void_()> *this_00;
  function<void_()> *in_stack_ffffffffffffff58;
  Guard *in_stack_ffffffffffffff60;
  function<void_()> local_90;
  anon_class_8_1_8991fb9c local_68 [8];
  ExpVarData local_24 [3];
  
  ExpVarData::ExpVarData(local_24,SemanticOp_Read);
  pSVar2 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      0x1e3b73);
  (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,in_RDI,local_24);
  __f = local_68;
  std::function<void()>::
  function<luna::SemanticAnalysisVisitor::Visit(luna::ElseIfStatement*,void*)::__0,void>
            (in_stack_ffffffffffffff50,__f);
  this_00 = &local_90;
  std::function<void()>::
  function<luna::SemanticAnalysisVisitor::Visit(luna::ElseIfStatement*,void*)::__1,void>
            (this_00,__f);
  Guard::Guard(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,this_00);
  std::function<void_()>::~function((function<void_()> *)0x1e3be7);
  std::function<void_()>::~function((function<void_()> *)0x1e3bf1);
  pSVar2 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      0x1e3c02);
  (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,in_RDI,0);
  Guard::~Guard(in_RDI);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                     0x1e3c37);
  if (bVar1) {
    pSVar2 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                       ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                        0x1e3c4e);
    (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,in_RDI,0);
  }
  return;
}

Assistant:

void SemanticAnalysisVisitor::Visit(ElseIfStatement *elseif_stmt, void *data)
    {
        ExpVarData exp_var_data{ SemanticOp_Read };
        elseif_stmt->exp_->Accept(this, &exp_var_data);

        {
            SEMANTIC_ANALYSIS_GUARD(EnterBlock, LeaveBlock);
            elseif_stmt->true_branch_->Accept(this, nullptr);
        }

        if (elseif_stmt->false_branch_)
            elseif_stmt->false_branch_->Accept(this, nullptr);
    }